

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ParameterSymbol::ParameterSymbol
          (ParameterSymbol *this,string_view name,SourceLocation loc,bool isLocal,bool isPort)

{
  ValueSymbol::ValueSymbol
            (&this->super_ValueSymbol,Parameter,name,loc,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x1003);
  (this->super_ParameterSymbolBase).symbol = (Symbol *)this;
  (this->super_ParameterSymbolBase).defaultValSyntax = (SyntaxNode *)0x0;
  (this->super_ParameterSymbolBase).isLocal = isLocal;
  (this->super_ParameterSymbolBase).isPort = isPort;
  this->value = (ConstantValue *)0x0;
  *(undefined8 *)((long)&this->value + 5) = 0;
  return;
}

Assistant:

ParameterSymbol::ParameterSymbol(std::string_view name, SourceLocation loc, bool isLocal,
                                 bool isPort) :
    ValueSymbol(SymbolKind::Parameter, name, loc,
                DeclaredTypeFlags::InferImplicit | DeclaredTypeFlags::InitializerCantSeeParent |
                    DeclaredTypeFlags::AllowUnboundedLiteral),
    ParameterSymbolBase(*this, isLocal, isPort) {
}